

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               DistantLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  uint uVar1;
  string *psVar2;
  Property *attr_00;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  ostream *poVar6;
  size_type sVar7;
  mapped_type *this;
  _Base_ptr p_Var8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  Attribute *attr;
  int iVar10;
  allocator local_2e9;
  string *local_2e8;
  string *local_2e0;
  Property *local_2d8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2d0;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2c8;
  ParseResult ret;
  string local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_278;
  _Base_ptr local_270;
  _Base_ptr local_268;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_260;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  _Any_data local_228;
  code *local_218;
  _Any_data local_208;
  code *local_1f8;
  ostringstream ss_e;
  code *local_1d8 [45];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ReconstructXformOpsFromProperties
                    (spec,&table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar3) {
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_268 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_260 = &light->angle;
    local_278 = &(light->super_NonboundableLight).props;
    local_2d0 = &(light->super_NonboundableLight).visibility;
    local_2c8 = &(light->super_NonboundableLight).purpose;
    local_2e8 = err;
    local_2e0 = warn;
    while( true ) {
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e;
      bVar3 = p_Var8 == local_268;
      if (bVar3) break;
      __lhs = p_Var8 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
      ::std::__cxx11::string::string((string *)name,"inputs:angle",(allocator *)&local_298);
      local_2d8 = (Property *)(p_Var8 + 2);
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_50,(Property *)(p_Var8 + 2),name,local_260);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar10 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar4 = false;
        iVar10 = 3;
      }
      else {
        bVar4 = true;
        if (ret.code != Unmatched) {
          local_270 = p_Var8;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar6 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd1e);
          ::std::operator<<(poVar6," ");
          ::std::__cxx11::string::string
                    ((string *)&local_70,"Parsing attribute `{}` failed. Error: {}",&local_2e9);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_298,(fmt *)&local_70,(string *)"inputs:angle",(char (*) [13])&ret.err,
                     name);
          poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&local_298);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar2 = local_2e8;
          if (local_2e8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_298,&local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar2);
            ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_298);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar4 = false;
          iVar10 = 1;
          p_Var8 = local_270;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar4) {
        bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"purpose");
        if (bVar4) {
          ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
          sVar7 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          attr_00 = local_2d8;
          if (sVar7 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,local_2d8);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var5 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var5) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar2 = local_2e0;
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar6 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd20);
                ::std::operator<<(poVar6," ");
                poVar6 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar6 = ::std::operator<<(poVar6,"purpose");
                poVar6 = ::std::operator<<(poVar6,"` token attribute. Set default token value.");
                ::std::operator<<(poVar6,"\n");
                if (psVar2 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_298,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2e8);
                  ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var8 + 7));
                ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,(string *)&ss_e);
LAB_001b99f5:
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b9d98;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            psVar2 = local_2e0;
            _ss_e = PurposeEnumHandler;
            local_1d8[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_298);
            bVar4 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_208,
                       (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              ((string *)&ret,bVar4,(EnumHandlerFun<tinyusdz::Purpose> *)&local_208,
                               &attr_00->_attrib,local_2c8,psVar2,local_2e8);
            if (local_1f8 != (code *)0x0) {
              (*local_1f8)(&local_208,&local_208,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar4) {
              AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var8 + 7));
              pcVar9 = "purpose";
LAB_001b9d4c:
              ::std::__cxx11::string::string((string *)&ret,pcVar9,(allocator *)&local_298);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
LAB_001b9d70:
            if (local_1d8[0] != (code *)0x0) {
              (*local_1d8[0])(&ss_e,&ss_e,3);
            }
            goto LAB_001b9d8d;
          }
        }
        else {
          bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"visibility");
          if (bVar4) {
            ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar7 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,local_2d8);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var5 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var5) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                psVar2 = local_2e0;
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar6 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd22);
                  ::std::operator<<(poVar6," ");
                  poVar6 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar6 = ::std::operator<<(poVar6,"visibility");
                  poVar6 = ::std::operator<<(poVar6,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar6,"\n");
                  if (psVar2 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_298,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_2e8);
                    ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_2d0->_metas,(AttrMetas *)(p_Var8 + 7));
                  ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&table,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ss_e);
                  goto LAB_001b99f5;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              psVar2 = local_2e0;
              _ss_e = VisibilityEnumHandler;
              local_1d8[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_298);
              bVar4 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_228,
                         (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)&ret,bVar4,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_228,
                                 &local_2d8->_attrib,local_2d0,psVar2,local_2e8);
              if (local_218 != (code *)0x0) {
                (*local_218)(&local_228,&local_228,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 1;
              if (bVar4) {
                AttrMetas::operator=(&local_2d0->_metas,(AttrMetas *)(p_Var8 + 7));
                pcVar9 = "visibility";
                goto LAB_001b9d4c;
              }
              goto LAB_001b9d70;
            }
          }
          else {
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar7 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](local_278,(key_type *)__lhs);
              Property::operator=(this,local_2d8);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
              ;
            }
            sVar7 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar7 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar6 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xd24);
              ::std::operator<<(poVar6," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs);
              poVar6 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::_M_dispose();
              psVar2 = local_2e0;
              if (local_2e0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_298,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e8);
                ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001b9d8d:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
LAB_001b9d98:
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
    }
  }
  else {
    bVar3 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar3;
}

Assistant:

bool ReconstructPrim<DistantLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DistantLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:angle", DistantLight, light->angle)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DistantLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DistantLight,
                   light->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}